

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

QEditorInfo * __thiscall
QAbstractItemViewPrivate::editorForIndex(QAbstractItemViewPrivate *this,QModelIndex *index)

{
  Data *pDVar1;
  Span *pSVar2;
  int iVar3;
  ulong uVar4;
  QEditorInfo *pQVar5;
  long in_FS_OFFSET;
  const_iterator cVar6;
  QPersistentModelIndex local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (editorForIndex(QModelIndex_const&)::nullInfo == '\0') {
    iVar3 = __cxa_guard_acquire(&editorForIndex(QModelIndex_const&)::nullInfo);
    if (iVar3 != 0) {
      editorForIndex::nullInfo.widget.wp = (QWeakPointer<QObject>)ZEXT816(0);
      editorForIndex::nullInfo.isStatic = false;
      __cxa_atexit(QEditorInfo::~QEditorInfo,&editorForIndex::nullInfo,0x7fe000);
      __cxa_guard_release(&editorForIndex(QModelIndex_const&)::nullInfo);
    }
  }
  pDVar1 = (this->indexEditorHash).d;
  pQVar5 = &editorForIndex::nullInfo;
  if ((pDVar1 != (Data *)0x0) && (pDVar1->size != 0)) {
    QPersistentModelIndex::QPersistentModelIndex(&local_30,index);
    cVar6 = QHash<QPersistentModelIndex,_QEditorInfo>::constFindImpl<QPersistentModelIndex>
                      (&this->indexEditorHash,&local_30);
    QPersistentModelIndex::~QPersistentModelIndex(&local_30);
    if (cVar6.i.d != (Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *)0x0 ||
        cVar6.i.bucket != 0) {
      pSVar2 = (cVar6.i.d)->spans;
      uVar4 = cVar6.i.bucket >> 7;
      pQVar5 = (QEditorInfo *)
               (pSVar2[uVar4].entries[pSVar2[uVar4].offsets[(uint)cVar6.i.bucket & 0x7f]].storage.
                data + 8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

const QEditorInfo & QAbstractItemViewPrivate::editorForIndex(const QModelIndex &index) const
{
    static QEditorInfo nullInfo;

    // do not try to search to avoid slow implicit cast from QModelIndex to QPersistentModelIndex
    if (indexEditorHash.isEmpty())
        return nullInfo;

    QIndexEditorHash::const_iterator it = indexEditorHash.find(index);
    if (it == indexEditorHash.end())
        return nullInfo;

    return it.value();
}